

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cc
# Opt level: O3

void lrit::to_json(json *j,ImageDataFunctionHeader *h)

{
  istringstream t;
  value_t t_00;
  uint uVar1;
  int iVar2;
  float *__nptr;
  float *pfVar3;
  istream *piVar4;
  int *piVar5;
  ulong uVar6;
  undefined8 uVar7;
  json_value jVar8;
  reference pvVar9;
  int iVar10;
  float fVar11;
  string k;
  string v;
  json map;
  string str;
  string line;
  istringstream lss;
  istringstream iss;
  array<float,_256UL> table;
  float *local_7f0;
  json_value local_7e8;
  undefined1 local_7e0;
  undefined7 uStack_7df;
  float *local_7c0;
  float *local_7b8;
  long local_7b0;
  undefined1 local_7a8;
  undefined7 uStack_7a7;
  json *local_798;
  undefined1 local_790 [8];
  json_value local_788;
  value_t local_780;
  json_value local_778;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_770;
  undefined1 *local_750;
  undefined8 local_748;
  undefined1 local_740;
  undefined7 uStack_73f;
  undefined1 local_730 [8];
  json_value local_728;
  ios_base local_6b8 [264];
  undefined1 local_5b0 [384];
  float local_430 [256];
  
  local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
  local_798 = j;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_770,
             (h->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             (h->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish);
  local_790[0] = null;
  local_788.object = (object_t *)0x0;
  std::__cxx11::istringstream::istringstream((istringstream *)local_5b0,(string *)&local_770,_S_in);
  local_750 = &local_740;
  local_748 = 0;
  local_740 = 0;
  do {
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_5b0,(string *)&local_750,'\n');
    uVar1 = *(uint *)(&piVar4->field_0x20 + (long)piVar4->_vptr_basic_istream[-3]);
    if ((uVar1 & 5) != 0) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_730,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_790);
      pvVar9 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)local_798,"Map");
      t = (istringstream)pvVar9->m_type;
      pvVar9->m_type = (value_t)local_730[0];
      jVar8 = pvVar9->m_value;
      pvVar9->m_value = local_728;
      local_730[0] = t;
      local_728 = jVar8;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)(local_730 + 8),(value_t)t);
      local_7e8.object = (object_t *)0x0;
      local_7f0._0_1_ = (string)0x2;
      local_7b8 = local_430;
      local_7c0 = (float *)&stack0xffffffffffffffd0;
      jVar8.object = (object_t *)
                     nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                     ::
                     create<std::vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,float_const*,float_const*>
                               (&local_7b8,&local_7c0);
      local_7e8.object = jVar8.object;
      pvVar9 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)local_798,"Table");
      t_00 = pvVar9->m_type;
      pvVar9->m_type = array;
      local_7f0 = (float *)CONCAT71(local_7f0._1_7_,t_00);
      local_7e8 = pvVar9->m_value;
      (pvVar9->m_value).object = (object_t *)jVar8;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)&local_7e8.boolean,t_00);
LAB_00119392:
      if (local_750 != &local_740) {
        operator_delete(local_750,CONCAT71(uStack_73f,local_740) + 1);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)local_5b0);
      std::ios_base::~ios_base((ios_base *)(local_5b0 + 0x78));
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)(local_790 + 8),local_790[0]);
      if ((uVar1 & 5) == 0) {
        local_778.object = (object_t *)0x0;
        local_780 = 3;
        local_778.object =
             (object_t *)
             nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::create<std::__cxx11::string,std::__cxx11::string_const&>(&local_770);
        pvVar9 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)local_798,"Original");
        local_780 = pvVar9->m_type;
        pvVar9->m_type = string;
        jVar8 = pvVar9->m_value;
        (pvVar9->m_value).object = (object_t *)local_778;
        local_778 = jVar8;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)&local_778.boolean,local_780);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_770._M_dataplus._M_p != &local_770.field_2) {
        operator_delete(local_770._M_dataplus._M_p,local_770.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_730,(string *)&local_750,_S_in);
    local_7e8.object = (object_t *)0x0;
    local_7e0 = 0;
    local_7b0 = 0;
    local_7a8 = 0;
    local_7f0 = (float *)&local_7e0;
    local_7b8 = (float *)&local_7a8;
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_730,(string *)&local_7f0,'=');
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_730,(string *)&local_7b8,'\n');
    std::__cxx11::string::_M_erase((ulong)&local_7f0,local_7e8.number_integer - 1);
    __nptr = local_7f0;
    if ((local_7e8.object == (object_t *)0x0) || (local_7b0 == 0)) {
LAB_00119289:
      if (local_7b8 != (float *)&local_7a8) {
        operator_delete(local_7b8,CONCAT71(uStack_7a7,local_7a8) + 1);
      }
      if (local_7f0 != (float *)&local_7e0) {
        operator_delete(local_7f0,CONCAT71(uStack_7df,local_7e0) + 1);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)local_730);
      std::ios_base::~ios_base((ios_base *)(local_730 + 0x78));
      goto LAB_00119392;
    }
    piVar5 = __errno_location();
    iVar2 = *piVar5;
    *piVar5 = 0;
    uVar6 = strtol((char *)__nptr,(char **)&local_7c0,10);
    pfVar3 = local_7b8;
    if (local_7c0 == __nptr) {
      uVar7 = std::__throw_invalid_argument("stoi");
LAB_00119489:
      if (local_7b8 != (float *)&local_7a8) {
        operator_delete(local_7b8,CONCAT71(uStack_7a7,local_7a8) + 1);
      }
      if (local_7f0 != (float *)&local_7e0) {
        operator_delete(local_7f0,CONCAT71(uStack_7df,local_7e0) + 1);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)local_730);
      std::ios_base::~ios_base((ios_base *)(local_730 + 0x78));
      if (local_750 != &local_740) {
        operator_delete(local_750,CONCAT71(uStack_73f,local_740) + 1);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)local_5b0);
      std::ios_base::~ios_base((ios_base *)(local_5b0 + 0x78));
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)(local_790 + 8),local_790[0]);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_770._M_dataplus._M_p != &local_770.field_2) {
        operator_delete(local_770._M_dataplus._M_p,local_770.field_2._M_allocated_capacity + 1);
      }
      _Unwind_Resume(uVar7);
    }
    if (((long)(int)uVar6 != uVar6) || (iVar10 = *piVar5, iVar10 == 0x22)) {
      uVar7 = std::__throw_out_of_range("stoi");
      goto LAB_00119489;
    }
    if (iVar10 == 0) {
      *piVar5 = iVar2;
      iVar10 = iVar2;
    }
    *piVar5 = 0;
    fVar11 = strtof((char *)local_7b8,(char **)&local_7c0);
    if (local_7c0 == pfVar3) {
      uVar7 = std::__throw_invalid_argument("stof");
      goto LAB_00119489;
    }
    if (*piVar5 == 0) {
      *piVar5 = iVar10;
    }
    else if (*piVar5 == 0x22) {
      uVar7 = std::__throw_out_of_range("stof");
      goto LAB_00119489;
    }
    if ((uVar6 & 0xffffff00) != 0) goto LAB_00119289;
    local_430[uVar6 & 0xff] = fVar11;
    if (local_7b8 != (float *)&local_7a8) {
      operator_delete(local_7b8,CONCAT71(uStack_7a7,local_7a8) + 1);
    }
    if (local_7f0 != (float *)&local_7e0) {
      operator_delete(local_7f0,CONCAT71(uStack_7df,local_7e0) + 1);
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)local_730);
    std::ios_base::~ios_base((ios_base *)(local_730 + 0x78));
  } while( true );
}

Assistant:

void to_json(json& j, const ImageDataFunctionHeader& h) {
  const auto str = std::string((const char*)h.data.data(), h.data.size());
  if (!tryDecodeImageDataFunctionHeader(j, str)) {
    j["Original"] = str;
  }
}